

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersector1<4,_16777232,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  int iVar25;
  long lVar26;
  byte *pbVar27;
  byte *pbVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined1 (*pauVar35) [16];
  int iVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  undefined4 *puVar38;
  undefined4 uVar39;
  byte *pbVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar68;
  undefined1 auVar64 [16];
  float fVar69;
  float fVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar95;
  float fVar97;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar100;
  float fVar101;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  float fVar120;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  int local_11dc;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  long local_11b0;
  RayHit *local_11a8;
  RayQueryContext *local_11a0;
  undefined1 (*local_1198) [16];
  RayQueryContext *local_1190;
  ulong local_1188;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  int *local_1168;
  byte *local_1160;
  undefined4 *local_1158;
  Intersectors *local_1150;
  float *local_1148;
  undefined4 local_1140;
  float local_1138;
  float local_1134;
  float local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  uint local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088 [4];
  undefined1 local_1078 [16];
  float local_1068 [4];
  undefined1 local_1058 [16];
  float local_1048 [4];
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined8 local_fb8;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar107 [16];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_1198 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar58 = *(float *)&This->ptr;
    fVar57 = *(float *)((long)&This->ptr + 4);
    fVar78 = *(float *)&This->leafIntersector;
    fVar80 = *(float *)((long)&This->leafIntersector + 4);
    fVar101 = *(float *)&(This->collider).collide;
    fVar109 = *(float *)((long)&(This->collider).collide + 4);
    fVar59 = *(float *)&(This->collider).name;
    fVar65 = *(float *)((long)&(This->collider).name + 4);
    fVar66 = 0.0;
    if (0.0 <= fVar80) {
      fVar66 = fVar80;
    }
    fVar80 = *(float *)&(This->intersector1).intersect;
    fVar67 = 0.0;
    if (0.0 <= fVar80) {
      fVar67 = fVar80;
    }
    uVar53 = -(uint)((float)DAT_01f4bd50 <= ABS(fVar101));
    uVar54 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar109));
    uVar55 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(fVar59));
    uVar56 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar65));
    auVar89._0_4_ = (uint)fVar101 & uVar53;
    auVar89._4_4_ = (uint)fVar109 & uVar54;
    auVar89._8_4_ = (uint)fVar59 & uVar55;
    auVar89._12_4_ = (uint)fVar65 & uVar56;
    auVar102._0_4_ = ~uVar53 & (uint)(float)DAT_01f4bd50;
    auVar102._4_4_ = ~uVar54 & (uint)DAT_01f4bd50._4_4_;
    auVar102._8_4_ = ~uVar55 & (uint)DAT_01f4bd50._8_4_;
    auVar102._12_4_ = ~uVar56 & (uint)DAT_01f4bd50._12_4_;
    auVar102 = auVar102 | auVar89;
    auVar88 = rcpps(auVar89,auVar102);
    fVar150 = auVar88._0_4_;
    fVar153 = auVar88._4_4_;
    fVar156 = auVar88._8_4_;
    fVar150 = (1.0 - auVar102._0_4_ * fVar150) * fVar150 + fVar150;
    fVar153 = (1.0 - auVar102._4_4_ * fVar153) * fVar153 + fVar153;
    fVar156 = (1.0 - auVar102._8_4_ * fVar156) * fVar156 + fVar156;
    uVar47 = (ulong)(fVar150 < 0.0) * 0x10;
    uVar52 = (ulong)(fVar153 < 0.0) << 4 | 0x20;
    uVar51 = (ulong)(fVar156 < 0.0) << 4 | 0x40;
    auVar88._4_4_ = fVar67;
    auVar88._0_4_ = fVar67;
    auVar88._8_4_ = fVar67;
    auVar88._12_4_ = fVar67;
    _local_1038 = mm_lookupmask_ps._240_8_;
    _uStack_1030 = mm_lookupmask_ps._248_8_;
    local_11a8 = ray;
    local_fc8 = fVar78;
    fStack_fc4 = fVar78;
    fStack_fc0 = fVar78;
    fStack_fbc = fVar78;
    local_fd8 = fVar66;
    fStack_fd4 = fVar66;
    fStack_fd0 = fVar66;
    fStack_fcc = fVar66;
    local_fe8 = fVar156;
    fStack_fe4 = fVar156;
    fStack_fe0 = fVar156;
    fStack_fdc = fVar156;
    local_ff8 = fVar58;
    fStack_ff4 = fVar58;
    fStack_ff0 = fVar58;
    fStack_fec = fVar58;
    local_1008 = fVar57;
    fStack_1004 = fVar57;
    fStack_1000 = fVar57;
    fStack_ffc = fVar57;
    local_1018 = fVar150;
    fStack_1014 = fVar150;
    fStack_1010 = fVar150;
    fStack_100c = fVar150;
    local_1028 = fVar153;
    fStack_1024 = fVar153;
    fStack_1020 = fVar153;
    fStack_101c = fVar153;
    local_11f8 = This;
    fVar101 = fVar78;
    fVar109 = fVar78;
    fVar59 = fVar78;
    fVar65 = fVar66;
    fVar67 = fVar66;
    fVar69 = fVar66;
    fVar77 = fVar156;
    fVar79 = fVar156;
    fVar86 = fVar156;
    fVar87 = fVar58;
    fVar95 = fVar58;
    fVar96 = fVar58;
    fVar97 = fVar57;
    fVar98 = fVar57;
    fVar99 = fVar57;
    fVar100 = fVar150;
    fVar108 = fVar150;
    fVar110 = fVar150;
    fVar111 = fVar153;
    fVar117 = fVar153;
    fVar118 = fVar153;
LAB_00573d51:
    if (local_1198 != (undefined1 (*) [16])&local_f78) {
      pauVar35 = local_1198 + -1;
      local_1198 = local_1198 + -1;
      if (*(float *)((long)*pauVar35 + 8) <= fVar80) {
        uVar41 = *(ulong *)*local_1198;
        while ((uVar41 & 8) == 0) {
          fVar119 = *(float *)((long)&(local_11f8->collider).name + 4);
          fVar80 = *(float *)&(local_11f8->intersector1).intersect;
          uVar37 = uVar41 & 0xfffffffffffffff0;
          pfVar24 = (float *)(uVar37 + 0x80 + uVar47);
          pfVar23 = (float *)(uVar37 + 0x20 + uVar47);
          auVar116._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar58) * fVar150;
          auVar116._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar87) * fVar100;
          auVar116._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar95) * fVar108;
          auVar116._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar96) * fVar110;
          auVar106._4_4_ = fVar65;
          auVar106._0_4_ = fVar66;
          auVar106._8_4_ = fVar67;
          auVar106._12_4_ = fVar69;
          auVar89 = maxps(auVar106,auVar116);
          pfVar24 = (float *)(uVar37 + 0x80 + uVar52);
          pfVar23 = (float *)(uVar37 + 0x20 + uVar52);
          auVar123._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar57) * fVar153;
          auVar123._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar97) * fVar111;
          auVar123._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar98) * fVar117;
          auVar123._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar99) * fVar118;
          pfVar24 = (float *)(uVar37 + 0x80 + uVar51);
          pfVar23 = (float *)(uVar37 + 0x20 + uVar51);
          auVar112._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar78) * fVar156;
          auVar112._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar101) * fVar77;
          auVar112._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar109) * fVar79;
          auVar112._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar59) * fVar86;
          auVar102 = maxps(auVar123,auVar112);
          _local_10f8 = maxps(auVar89,auVar102);
          pfVar24 = (float *)(uVar37 + 0x80 + (uVar47 ^ 0x10));
          pfVar23 = (float *)(uVar37 + 0x20 + (uVar47 ^ 0x10));
          auVar113._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar58) * fVar150;
          auVar113._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar87) * fVar100;
          auVar113._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar95) * fVar108;
          auVar113._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar96) * fVar110;
          auVar89 = minps(auVar88,auVar113);
          pfVar24 = (float *)(uVar37 + 0x80 + (uVar52 ^ 0x10));
          pfVar23 = (float *)(uVar37 + 0x20 + (uVar52 ^ 0x10));
          auVar114._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar57) * fVar153;
          auVar114._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar97) * fVar111;
          auVar114._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar98) * fVar117;
          auVar114._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar99) * fVar118;
          pfVar24 = (float *)(uVar37 + 0x80 + (uVar51 ^ 0x10));
          pfVar23 = (float *)(uVar37 + 0x20 + (uVar51 ^ 0x10));
          auVar121._0_4_ = ((*pfVar24 * fVar119 + *pfVar23) - fVar78) * fVar156;
          auVar121._4_4_ = ((pfVar24[1] * fVar119 + pfVar23[1]) - fVar101) * fVar77;
          auVar121._8_4_ = ((pfVar24[2] * fVar119 + pfVar23[2]) - fVar109) * fVar79;
          auVar121._12_4_ = ((pfVar24[3] * fVar119 + pfVar23[3]) - fVar59) * fVar86;
          auVar102 = minps(auVar114,auVar121);
          auVar89 = minps(auVar89,auVar102);
          if (((uint)uVar41 & 7) == 6) {
            bVar29 = (fVar119 < *(float *)(uVar37 + 0xf0) && *(float *)(uVar37 + 0xe0) <= fVar119)
                     && local_10f8._0_4_ <= auVar89._0_4_;
            bVar30 = (fVar119 < *(float *)(uVar37 + 0xf4) && *(float *)(uVar37 + 0xe4) <= fVar119)
                     && local_10f8._4_4_ <= auVar89._4_4_;
            bVar31 = (fVar119 < *(float *)(uVar37 + 0xf8) && *(float *)(uVar37 + 0xe8) <= fVar119)
                     && local_10f8._8_4_ <= auVar89._8_4_;
            bVar32 = (fVar119 < *(float *)(uVar37 + 0xfc) && *(float *)(uVar37 + 0xec) <= fVar119)
                     && local_10f8._12_4_ <= auVar89._12_4_;
          }
          else {
            bVar29 = local_10f8._0_4_ <= auVar89._0_4_;
            bVar30 = local_10f8._4_4_ <= auVar89._4_4_;
            bVar31 = local_10f8._8_4_ <= auVar89._8_4_;
            bVar32 = local_10f8._12_4_ <= auVar89._12_4_;
          }
          auVar81._0_4_ = (uint)bVar29 * -0x80000000;
          auVar81._4_4_ = (uint)bVar30 * -0x80000000;
          auVar81._8_4_ = (uint)bVar31 * -0x80000000;
          auVar81._12_4_ = (uint)bVar32 * -0x80000000;
          uVar53 = movmskps((int)context,auVar81);
          context = (RayQueryContext *)(ulong)uVar53;
          if (uVar53 == 0) goto LAB_00573d51;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar53 != 0) {
            for (; ((byte)uVar53 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar41 = *(ulong *)(uVar37 + (long)context * 8);
          uVar53 = (uVar53 & 0xff) - 1 & uVar53 & 0xff;
          if (uVar53 != 0) {
            uVar54 = *(uint *)(local_10f8 + (long)context * 4);
            lVar49 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
              }
            }
            uVar43 = *(ulong *)(uVar37 + lVar49 * 8);
            uVar55 = *(uint *)(local_10f8 + lVar49 * 4);
            uVar53 = uVar53 - 1 & uVar53;
            context = (RayQueryContext *)(ulong)uVar53;
            if (uVar53 == 0) {
              if (uVar54 < uVar55) {
                *(ulong *)*local_1198 = uVar43;
                *(uint *)((long)*local_1198 + 8) = uVar55;
                local_1198 = local_1198 + 1;
              }
              else {
                *(ulong *)*local_1198 = uVar41;
                *(uint *)((long)*local_1198 + 8) = uVar54;
                uVar41 = uVar43;
                local_1198 = local_1198 + 1;
              }
            }
            else {
              auVar70._8_4_ = uVar54;
              auVar70._0_8_ = uVar41;
              auVar70._12_4_ = 0;
              auVar82._8_4_ = uVar55;
              auVar82._0_8_ = uVar43;
              auVar82._12_4_ = 0;
              lVar49 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar53 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
              uVar41 = *(ulong *)(uVar37 + lVar49 * 8);
              iVar36 = *(int *)(local_10f8 + lVar49 * 4);
              auVar90._8_4_ = iVar36;
              auVar90._0_8_ = uVar41;
              auVar90._12_4_ = 0;
              auVar103._8_4_ = -(uint)((int)uVar54 < (int)uVar55);
              uVar53 = uVar53 - 1 & uVar53;
              if (uVar53 == 0) {
                auVar103._4_4_ = auVar103._8_4_;
                auVar103._0_4_ = auVar103._8_4_;
                auVar103._12_4_ = auVar103._8_4_;
                auVar89 = auVar70 & auVar103 | ~auVar103 & auVar82;
                auVar102 = auVar82 & auVar103 | ~auVar103 & auVar70;
                auVar104._8_4_ = -(uint)(auVar89._8_4_ < iVar36);
                auVar104._0_8_ = CONCAT44(auVar104._8_4_,auVar104._8_4_);
                auVar104._12_4_ = auVar104._8_4_;
                uVar41 = ~auVar104._0_8_ & uVar41 | auVar89._0_8_ & auVar104._0_8_;
                auVar89 = auVar90 & auVar104 | ~auVar104 & auVar89;
                auVar71._8_4_ = -(uint)(auVar102._8_4_ < auVar89._8_4_);
                auVar71._4_4_ = auVar71._8_4_;
                auVar71._0_4_ = auVar71._8_4_;
                auVar71._12_4_ = auVar71._8_4_;
                *local_1198 = ~auVar71 & auVar102 | auVar89 & auVar71;
                local_1198[1] = auVar102 & auVar71 | ~auVar71 & auVar89;
                local_1198 = local_1198 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                iVar25 = *(int *)(local_10f8 + (long)context * 4);
                auVar115._8_4_ = iVar25;
                auVar115._0_8_ = *(undefined8 *)(uVar37 + (long)context * 8);
                auVar115._12_4_ = 0;
                auVar105._4_4_ = auVar103._8_4_;
                auVar105._0_4_ = auVar103._8_4_;
                auVar105._8_4_ = auVar103._8_4_;
                auVar105._12_4_ = auVar103._8_4_;
                auVar89 = auVar70 & auVar105 | ~auVar105 & auVar82;
                auVar102 = auVar82 & auVar105 | ~auVar105 & auVar70;
                auVar122._0_4_ = -(uint)(iVar36 < iVar25);
                auVar122._4_4_ = -(uint)(iVar36 < iVar25);
                auVar122._8_4_ = -(uint)(iVar36 < iVar25);
                auVar122._12_4_ = -(uint)(iVar36 < iVar25);
                auVar106 = auVar90 & auVar122 | ~auVar122 & auVar115;
                auVar123 = ~auVar122 & auVar90 | auVar115 & auVar122;
                auVar91._8_4_ = -(uint)(auVar102._8_4_ < auVar123._8_4_);
                auVar91._4_4_ = auVar91._8_4_;
                auVar91._0_4_ = auVar91._8_4_;
                auVar91._12_4_ = auVar91._8_4_;
                auVar116 = auVar102 & auVar91 | ~auVar91 & auVar123;
                auVar83._8_4_ = -(uint)(auVar89._8_4_ < auVar106._8_4_);
                auVar83._0_8_ = CONCAT44(auVar83._8_4_,auVar83._8_4_);
                auVar83._12_4_ = auVar83._8_4_;
                uVar41 = auVar89._0_8_ & auVar83._0_8_ | ~auVar83._0_8_ & auVar106._0_8_;
                auVar89 = ~auVar83 & auVar89 | auVar106 & auVar83;
                auVar72._8_4_ = -(uint)(auVar89._8_4_ < auVar116._8_4_);
                auVar72._4_4_ = auVar72._8_4_;
                auVar72._0_4_ = auVar72._8_4_;
                auVar72._12_4_ = auVar72._8_4_;
                *local_1198 = ~auVar91 & auVar102 | auVar123 & auVar91;
                local_1198[1] = ~auVar72 & auVar89 | auVar116 & auVar72;
                local_1198[2] = auVar89 & auVar72 | ~auVar72 & auVar116;
                local_1198 = local_1198 + 3;
              }
            }
          }
        }
        local_1190 = (RayQueryContext *)((ulong)((uint)uVar41 & 0xf) - 8);
        uVar41 = uVar41 & 0xfffffffffffffff0;
        local_11a0 = (RayQueryContext *)0x0;
        while (local_11a0 != local_1190) {
          lVar42 = (long)local_11a0 * 0x50;
          local_11b0 = *(long *)&(ray->super_RayK<1>).org.field_0;
          lVar49 = *(long *)(*(long *)(local_11b0 + 0x1e8) +
                            (ulong)*(uint *)(uVar41 + 0x30 + lVar42) * 8);
          local_11d8._0_4_ = *(float *)(lVar49 + 0x28);
          fVar57 = ((*(float *)((long)&(local_11f8->collider).name + 4) - *(float *)(lVar49 + 0x2c))
                   / (*(float *)(lVar49 + 0x30) - *(float *)(lVar49 + 0x2c))) *
                   *(float *)(lVar49 + 0x28);
          fVar58 = floorf(fVar57);
          if ((float)local_11d8._0_4_ + -1.0 <= fVar58) {
            fVar58 = (float)local_11d8._0_4_ + -1.0;
          }
          fVar78 = 0.0;
          if (0.0 <= fVar58) {
            fVar78 = fVar58;
          }
          uVar50 = (ulong)*(uint *)(uVar41 + 4 + lVar42);
          lVar26 = *(long *)(*(long *)(lVar49 + 0xe0) + (long)(int)fVar78 * 0x38);
          lVar49 = *(long *)(*(long *)(lVar49 + 0xe0) + 0x38 + (long)(int)fVar78 * 0x38);
          pfVar23 = (float *)(lVar26 + (ulong)*(uint *)(uVar41 + lVar42) * 4);
          uVar37 = (ulong)*(uint *)(uVar41 + 0x10 + lVar42);
          pfVar24 = (float *)(lVar26 + uVar37 * 4);
          uVar43 = CONCAT44(0,*(uint *)(uVar41 + 0x20 + lVar42));
          local_11d8._0_8_ = uVar43;
          puVar1 = (undefined8 *)(lVar26 + uVar43 * 4);
          uVar33 = *puVar1;
          uVar34 = puVar1[1];
          pfVar2 = (float *)(lVar26 + uVar50 * 4);
          local_1178 = (ulong)*(uint *)(uVar41 + 0x14 + lVar42);
          pfVar3 = (float *)(lVar26 + local_1178 * 4);
          uVar44 = (ulong)*(uint *)(uVar41 + 0x24 + lVar42);
          pfVar4 = (float *)(lVar26 + uVar44 * 4);
          uVar45 = (ulong)*(uint *)(uVar41 + 8 + lVar42);
          pfVar5 = (float *)(lVar26 + uVar45 * 4);
          local_1188 = (ulong)*(uint *)(uVar41 + 0x18 + lVar42);
          pfVar6 = (float *)(lVar26 + local_1188 * 4);
          local_1170 = (ulong)*(uint *)(uVar41 + 0x28 + lVar42);
          pfVar7 = (float *)(lVar26 + local_1170 * 4);
          uVar46 = (ulong)*(uint *)(uVar41 + 0xc + lVar42);
          pfVar8 = (float *)(lVar26 + uVar46 * 4);
          local_1180 = (ulong)*(uint *)(uVar41 + 0x1c + lVar42);
          pfVar9 = (float *)(lVar26 + local_1180 * 4);
          uVar48 = (ulong)*(uint *)(uVar41 + 0x2c + lVar42);
          pfVar10 = (float *)(lVar26 + uVar48 * 4);
          pfVar11 = (float *)(lVar49 + (ulong)*(uint *)(uVar41 + lVar42) * 4);
          pfVar12 = (float *)(lVar49 + uVar37 * 4);
          fVar57 = fVar57 - fVar78;
          pfVar13 = (float *)(lVar49 + uVar50 * 4);
          pfVar14 = (float *)(lVar49 + uVar45 * 4);
          local_f98 = pfVar24[2];
          fStack_f94 = pfVar3[2];
          fStack_f90 = pfVar6[2];
          fStack_f8c = pfVar9[2];
          local_fb8 = CONCAT44(*pfVar3,*pfVar24);
          _local_fa8 = CONCAT44(*pfVar9,*pfVar6);
          local_1208 = (float)uVar33;
          fStack_1204 = (float)((ulong)uVar33 >> 0x20);
          fStack_1200 = (float)uVar34;
          pfVar15 = (float *)(lVar49 + uVar46 * 4);
          local_11f8 = (Intersectors *)CONCAT44(pfVar10[2],pfVar7[2]);
          pfVar16 = (float *)(lVar49 + local_1188 * 4);
          pfVar17 = (float *)(lVar49 + local_1178 * 4);
          pfVar18 = (float *)(lVar49 + local_1180 * 4);
          pfVar19 = (float *)(lVar49 + uVar43 * 4);
          pfVar20 = (float *)(lVar49 + local_1170 * 4);
          pfVar21 = (float *)(lVar49 + uVar44 * 4);
          pfVar22 = (float *)(lVar49 + uVar48 * 4);
          fVar58 = 1.0 - fVar57;
          fVar111 = *pfVar23 * fVar58 + *pfVar11 * fVar57;
          fVar117 = *pfVar2 * fVar58 + *pfVar13 * fVar57;
          fVar118 = *pfVar5 * fVar58 + *pfVar14 * fVar57;
          fVar119 = *pfVar8 * fVar58 + *pfVar15 * fVar57;
          fVar142 = pfVar23[1] * fVar58 + pfVar11[1] * fVar57;
          fVar144 = pfVar2[1] * fVar58 + pfVar13[1] * fVar57;
          fVar146 = pfVar5[1] * fVar58 + pfVar14[1] * fVar57;
          fVar148 = pfVar8[1] * fVar58 + pfVar15[1] * fVar57;
          fVar86 = *pfVar6 * fVar58 + pfVar11[2] * fVar57;
          fVar95 = *pfVar9 * fVar58 + pfVar13[2] * fVar57;
          fVar97 = fStack_fa0 * fVar58 + pfVar14[2] * fVar57;
          fVar99 = fStack_f9c * fVar58 + pfVar15[2] * fVar57;
          fStack_11fc = (float)((ulong)uVar34 >> 0x20);
          puVar1 = (undefined8 *)(uVar41 + 0x30 + lVar42);
          local_f88 = *puVar1;
          uStack_f80 = puVar1[1];
          puVar1 = (undefined8 *)(uVar41 + 0x40 + lVar42);
          local_1108 = *puVar1;
          uStack_1100 = puVar1[1];
          fVar120 = fVar111 - (*pfVar24 * fVar58 + *pfVar12 * fVar57);
          fVar126 = fVar117 - (*pfVar3 * fVar58 + *pfVar17 * fVar57);
          fVar127 = fVar118 - (fStack_fb0 * fVar58 + *pfVar16 * fVar57);
          fVar128 = fVar119 - (fStack_fac * fVar58 + *pfVar18 * fVar57);
          fVar59 = fVar142 - (pfVar24[1] * fVar58 + pfVar12[1] * fVar57);
          fVar65 = fVar144 - (pfVar3[1] * fVar58 + pfVar17[1] * fVar57);
          fVar66 = fVar146 - (pfVar6[1] * fVar58 + pfVar16[1] * fVar57);
          fVar67 = fVar148 - (pfVar9[1] * fVar58 + pfVar18[1] * fVar57);
          fVar151 = fVar86 - (pfVar24[2] * fVar58 + pfVar12[2] * fVar57);
          fVar154 = fVar95 - (pfVar3[2] * fVar58 + pfVar17[2] * fVar57);
          fVar157 = fVar97 - (pfVar6[2] * fVar58 + pfVar16[2] * fVar57);
          fVar159 = fVar99 - (pfVar9[2] * fVar58 + pfVar18[2] * fVar57);
          fVar69 = (local_1208 * fVar58 + *pfVar19 * fVar57) - fVar111;
          fVar156 = (*pfVar4 * fVar58 + *pfVar21 * fVar57) - fVar117;
          fVar77 = (*pfVar7 * fVar58 + *pfVar20 * fVar57) - fVar118;
          fVar79 = (*pfVar10 * fVar58 + *pfVar22 * fVar57) - fVar119;
          fVar100 = (fStack_1204 * fVar58 + pfVar19[1] * fVar57) - fVar142;
          fVar108 = (pfVar4[1] * fVar58 + pfVar21[1] * fVar57) - fVar144;
          fVar110 = (pfVar7[1] * fVar58 + pfVar20[1] * fVar57) - fVar146;
          fVar153 = (pfVar10[1] * fVar58 + pfVar22[1] * fVar57) - fVar148;
          fVar129 = (fVar58 * fStack_1200 + fVar57 * pfVar19[2]) - fVar86;
          fVar130 = (fVar58 * pfVar4[2] + fVar57 * pfVar21[2]) - fVar95;
          fVar131 = (fVar58 * fStack_1200 + fVar57 * pfVar20[2]) - fVar97;
          fVar132 = (fVar58 * fStack_11fc + fVar57 * pfVar22[2]) - fVar99;
          fVar138 = fVar151 * fVar100 - fVar59 * fVar129;
          fVar139 = fVar154 * fVar108 - fVar65 * fVar130;
          fVar140 = fVar157 * fVar110 - fVar66 * fVar131;
          fVar141 = fVar159 * fVar153 - fVar67 * fVar132;
          fVar58 = *(float *)&local_11f8->ptr;
          fVar57 = *(float *)((long)&local_11f8->ptr + 4);
          fVar78 = *(float *)&local_11f8->leafIntersector;
          fVar80 = *(float *)&(local_11f8->collider).collide;
          fVar101 = *(float *)((long)&(local_11f8->collider).collide + 4);
          fVar109 = *(float *)&(local_11f8->collider).name;
          fVar111 = fVar111 - fVar58;
          fVar117 = fVar117 - fVar58;
          fVar118 = fVar118 - fVar58;
          fVar119 = fVar119 - fVar58;
          fVar142 = fVar142 - fVar57;
          fVar144 = fVar144 - fVar57;
          fVar146 = fVar146 - fVar57;
          fVar148 = fVar148 - fVar57;
          fVar161 = fVar111 * fVar101 - fVar142 * fVar80;
          fVar162 = fVar117 * fVar101 - fVar144 * fVar80;
          fVar163 = fVar118 * fVar101 - fVar146 * fVar80;
          fVar164 = fVar119 * fVar101 - fVar148 * fVar80;
          auVar60._0_4_ = fVar120 * fVar129 - fVar151 * fVar69;
          auVar60._4_4_ = fVar126 * fVar130 - fVar154 * fVar156;
          auVar60._8_4_ = fVar127 * fVar131 - fVar157 * fVar77;
          auVar60._12_4_ = fVar128 * fVar132 - fVar159 * fVar79;
          fVar86 = fVar86 - fVar78;
          fVar95 = fVar95 - fVar78;
          fVar97 = fVar97 - fVar78;
          fVar99 = fVar99 - fVar78;
          fVar87 = fVar86 * fVar80 - fVar111 * fVar109;
          fVar96 = fVar95 * fVar80 - fVar117 * fVar109;
          fVar98 = fVar97 * fVar80 - fVar118 * fVar109;
          fVar150 = fVar99 * fVar80 - fVar119 * fVar109;
          fVar152 = fVar59 * fVar69 - fVar120 * fVar100;
          fVar155 = fVar65 * fVar156 - fVar126 * fVar108;
          fVar158 = fVar66 * fVar77 - fVar127 * fVar110;
          fVar160 = fVar67 * fVar79 - fVar128 * fVar153;
          fVar143 = fVar142 * fVar109 - fVar86 * fVar101;
          fVar145 = fVar144 * fVar109 - fVar95 * fVar101;
          fVar147 = fVar146 * fVar109 - fVar97 * fVar101;
          fVar149 = fVar148 * fVar109 - fVar99 * fVar101;
          fVar133 = fVar80 * fVar138 + fVar101 * auVar60._0_4_ + fVar109 * fVar152;
          fVar135 = fVar80 * fVar139 + fVar101 * auVar60._4_4_ + fVar109 * fVar155;
          fVar136 = fVar80 * fVar140 + fVar101 * auVar60._8_4_ + fVar109 * fVar158;
          fVar137 = fVar80 * fVar141 + fVar101 * auVar60._12_4_ + fVar109 * fVar160;
          uVar53 = (uint)fVar133 & 0x80000000;
          uVar54 = (uint)fVar135 & 0x80000000;
          uVar55 = (uint)fVar136 & 0x80000000;
          uVar56 = (uint)fVar137 & 0x80000000;
          fVar58 = (float)((uint)(fVar69 * fVar143 + fVar100 * fVar87 + fVar129 * fVar161) ^ uVar53)
          ;
          fVar57 = (float)((uint)(fVar156 * fVar145 + fVar108 * fVar96 + fVar130 * fVar162) ^ uVar54
                          );
          fVar78 = (float)((uint)(fVar77 * fVar147 + fVar110 * fVar98 + fVar131 * fVar163) ^ uVar55)
          ;
          fVar80 = (float)((uint)(fVar79 * fVar149 + fVar153 * fVar150 + fVar132 * fVar164) ^ uVar56
                          );
          fVar59 = (float)((uint)(fVar143 * fVar120 + fVar87 * fVar59 + fVar161 * fVar151) ^ uVar53)
          ;
          fVar65 = (float)((uint)(fVar145 * fVar126 + fVar96 * fVar65 + fVar162 * fVar154) ^ uVar54)
          ;
          fVar66 = (float)((uint)(fVar147 * fVar127 + fVar98 * fVar66 + fVar163 * fVar157) ^ uVar55)
          ;
          fVar67 = (float)((uint)(fVar149 * fVar128 + fVar150 * fVar67 + fVar164 * fVar159) ^ uVar56
                          );
          fVar101 = ABS(fVar133);
          fVar109 = ABS(fVar135);
          auVar107._0_8_ = CONCAT44(fVar135,fVar133) & 0x7fffffff7fffffff;
          auVar107._8_4_ = ABS(fVar136);
          auVar107._12_4_ = ABS(fVar137);
          auVar92._0_4_ =
               -(uint)(fVar58 + fVar59 <= fVar101) &
               -(uint)((0.0 <= fVar59 && 0.0 <= fVar58) && fVar133 != 0.0) & local_1038;
          auVar92._4_4_ =
               -(uint)(fVar57 + fVar65 <= fVar109) &
               -(uint)((0.0 <= fVar65 && 0.0 <= fVar57) && fVar135 != 0.0) & uStack_1034;
          auVar92._8_4_ =
               -(uint)(fVar78 + fVar66 <= auVar107._8_4_) &
               -(uint)((0.0 <= fVar66 && 0.0 <= fVar78) && fVar136 != 0.0) & uStack_1030;
          auVar92._12_4_ =
               -(uint)(fVar80 + fVar67 <= auVar107._12_4_) &
               -(uint)((0.0 <= fVar67 && 0.0 <= fVar80) && fVar137 != 0.0) & uStack_102c;
          iVar36 = movmskps((int)lVar42,auVar92);
          ray = local_11a8;
          if (iVar36 != 0) {
            auVar124._0_4_ =
                 (float)(uVar53 ^ (uint)(fVar111 * fVar138 +
                                        fVar142 * auVar60._0_4_ + fVar86 * fVar152));
            auVar124._4_4_ =
                 (float)(uVar54 ^ (uint)(fVar117 * fVar139 +
                                        fVar144 * auVar60._4_4_ + fVar95 * fVar155));
            auVar124._8_4_ =
                 (float)(uVar55 ^ (uint)(fVar118 * fVar140 +
                                        fVar146 * auVar60._8_4_ + fVar97 * fVar158));
            auVar124._12_4_ =
                 (float)(uVar56 ^ (uint)(fVar119 * fVar141 +
                                        fVar148 * auVar60._12_4_ + fVar99 * fVar160));
            fVar69 = *(float *)((long)&local_11f8->leafIntersector + 4);
            auVar134._0_8_ = (local_11f8->intersector1).intersect;
            auVar134._8_8_ = (local_11f8->intersector1).occluded;
            fVar156 = (float)auVar134._0_8_;
            uVar53 = (uint)((ulong)auVar134._0_8_ >> 0x20);
            auVar84._0_4_ =
                 -(uint)(auVar124._0_4_ <= fVar156 * fVar101 && fVar69 * fVar101 < auVar124._0_4_) &
                 auVar92._0_4_;
            auVar84._4_4_ =
                 -(uint)(auVar124._4_4_ <= fVar156 * fVar109 && fVar69 * fVar109 < auVar124._4_4_) &
                 auVar92._4_4_;
            auVar84._8_4_ =
                 -(uint)(auVar124._8_4_ <= fVar156 * auVar107._8_4_ &&
                        fVar69 * auVar107._8_4_ < auVar124._8_4_) & auVar92._8_4_;
            auVar84._12_4_ =
                 -(uint)(auVar124._12_4_ <= fVar156 * auVar107._12_4_ &&
                        fVar69 * auVar107._12_4_ < auVar124._12_4_) & auVar92._12_4_;
            iVar36 = movmskps(iVar36,auVar84);
            if (iVar36 != 0) {
              local_10f8._4_4_ = fVar57;
              local_10f8._0_4_ = fVar58;
              fStack_10f0 = fVar78;
              fStack_10ec = fVar80;
              local_10e8 = fVar59;
              fStack_10e4 = fVar65;
              fStack_10e0 = fVar66;
              fStack_10dc = fVar67;
              local_10d8 = auVar124;
              local_10c8 = auVar107;
              local_10a8 = auVar84;
              local_1068[0] = fVar138;
              local_1068[1] = fVar139;
              local_1068[2] = fVar140;
              local_1068[3] = fVar141;
              local_1058 = auVar60;
              local_1048[0] = fVar152;
              local_1048[1] = fVar155;
              local_1048[2] = fVar158;
              local_1048[3] = fVar160;
              local_11c8 = auVar84;
              auVar88 = rcpps(auVar60,auVar107);
              fVar69 = auVar88._0_4_;
              fVar156 = auVar88._4_4_;
              fVar77 = auVar88._8_4_;
              fVar79 = auVar88._12_4_;
              fVar69 = (1.0 - fVar101 * fVar69) * fVar69 + fVar69;
              fVar156 = (1.0 - fVar109 * fVar156) * fVar156 + fVar156;
              fVar77 = (1.0 - auVar107._8_4_ * fVar77) * fVar77 + fVar77;
              fVar79 = (1.0 - auVar107._12_4_ * fVar79) * fVar79 + fVar79;
              auVar125._0_4_ = auVar124._0_4_ * fVar69;
              auVar125._4_4_ = auVar124._4_4_ * fVar156;
              auVar125._8_4_ = auVar124._8_4_ * fVar77;
              auVar125._12_4_ = auVar124._12_4_ * fVar79;
              local_1078 = auVar125;
              local_1098[0] = fVar58 * fVar69;
              local_1098[1] = fVar57 * fVar156;
              local_1098[2] = fVar78 * fVar77;
              local_1098[3] = fVar80 * fVar79;
              local_1088[0] = fVar69 * fVar59;
              local_1088[1] = fVar156 * fVar65;
              local_1088[2] = fVar77 * fVar66;
              local_1088[3] = fVar79 * fVar67;
              auVar61._0_4_ = auVar84._0_4_ & (uint)auVar125._0_4_;
              auVar61._4_4_ = auVar84._4_4_ & (uint)auVar125._4_4_;
              auVar61._8_4_ = auVar84._8_4_ & (uint)auVar125._8_4_;
              auVar61._12_4_ = auVar84._12_4_ & (uint)auVar125._12_4_;
              auVar73._0_8_ = CONCAT44(~auVar84._4_4_,~auVar84._0_4_) & 0x7f8000007f800000;
              auVar73._8_4_ = ~auVar84._8_4_ & 0x7f800000;
              auVar73._12_4_ = ~auVar84._12_4_ & 0x7f800000;
              auVar73 = auVar73 | auVar61;
              auVar93._4_4_ = auVar73._0_4_;
              auVar93._0_4_ = auVar73._4_4_;
              auVar93._8_4_ = auVar73._12_4_;
              auVar93._12_4_ = auVar73._8_4_;
              auVar88 = minps(auVar93,auVar73);
              auVar62._0_8_ = auVar88._8_8_;
              auVar62._8_4_ = auVar88._0_4_;
              auVar62._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar62,auVar88);
              auVar63._0_8_ =
                   CONCAT44(-(uint)(auVar88._4_4_ == auVar73._4_4_) & auVar84._4_4_,
                            -(uint)(auVar88._0_4_ == auVar73._0_4_) & auVar84._0_4_);
              auVar63._8_4_ = -(uint)(auVar88._8_4_ == auVar73._8_4_) & auVar84._8_4_;
              auVar63._12_4_ = -(uint)(auVar88._12_4_ == auVar73._12_4_) & auVar84._12_4_;
              iVar36 = movmskps(iVar36,auVar63);
              if (iVar36 != 0) {
                auVar84._8_4_ = auVar63._8_4_;
                auVar84._0_8_ = auVar63._0_8_;
                auVar84._12_4_ = auVar63._12_4_;
              }
              uVar39 = movmskps((int)local_11a0,auVar84);
              uVar37 = CONCAT44((int)((ulong)local_11a0 >> 0x20),uVar39);
              lVar49 = 0;
              lVar42 = local_11b0;
              if (uVar37 != 0) {
                for (; (uVar37 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
LAB_005747c4:
              uVar54 = *(uint *)((long)&local_f88 + lVar49 * 4);
              pbVar40 = (byte *)(ulong)uVar54;
              pbVar27 = *(byte **)(*(long *)(lVar42 + 0x1e8) + (long)pbVar40 * 8);
              if ((*(uint *)(pbVar27 + 0x34) & uVar53) == 0) {
                *(undefined4 *)(local_11c8 + lVar49 * 4) = 0;
              }
              else {
                pbVar28 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
                if (*(long *)(pbVar28 + 0x10) == 0) {
                  puVar38 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(pbVar27 + 0x40) == 0) {
                    fVar58 = local_1098[lVar49];
                    fVar57 = local_1088[lVar49];
                    *(float *)&(local_11f8->intersector1).intersect = local_1068[lVar49 + -4];
                    *(float *)&(local_11f8->intersector1).pointQuery = local_1068[lVar49];
                    *(float *)((long)&(local_11f8->intersector1).pointQuery + 4) =
                         local_1048[lVar49 + -4];
                    *(float *)&(local_11f8->intersector1).name = local_1048[lVar49];
                    *(float *)((long)&(local_11f8->intersector1).name + 4) = fVar58;
                    *(float *)&(local_11f8->intersector4).intersect = fVar57;
                    *(undefined4 *)((long)&(local_11f8->intersector4).intersect + 4) =
                         *(undefined4 *)((long)&local_1108 + lVar49 * 4);
                    *(uint *)&(local_11f8->intersector4).occluded = uVar54;
                    *(undefined4 *)((long)&(local_11f8->intersector4).occluded + 4) = *puVar38;
                    *(undefined4 *)&(local_11f8->intersector4).name = puVar38[1];
                    goto LAB_00574647;
                  }
                  local_11d8 = auVar134;
                }
                else {
                  local_11d8 = auVar134;
                  puVar38 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                }
                local_1138 = local_1068[lVar49];
                local_1134 = local_1048[lVar49 + -4];
                local_1130 = local_1048[lVar49];
                local_112c = local_1098[lVar49];
                local_1128 = local_1088[lVar49];
                local_1124 = *(undefined4 *)((long)&local_1108 + lVar49 * 4);
                local_1120 = uVar54;
                local_111c = *puVar38;
                local_1118 = puVar38[1];
                *(float *)&(local_11f8->intersector1).intersect = local_1068[lVar49 + -4];
                local_11dc = -1;
                local_1168 = &local_11dc;
                pbVar40 = *(byte **)(pbVar27 + 0x18);
                local_1160 = pbVar40;
                local_1158 = puVar38;
                local_1150 = local_11f8;
                local_1148 = &local_1138;
                local_1140 = 1;
                local_11d8 = auVar134;
                if (((*(code **)(pbVar27 + 0x40) == (code *)0x0) ||
                    ((**(code **)(pbVar27 + 0x40))(&local_1168), *local_1168 != 0)) &&
                   ((*(code **)(pbVar28 + 0x10) == (code *)0x0 ||
                    (((pbVar40 = pbVar28, (*pbVar28 & 2) == 0 &&
                      (pbVar40 = pbVar27, (pbVar27[0x3e] & 0x40) == 0)) ||
                     ((**(code **)(pbVar28 + 0x10))(&local_1168), *local_1168 != 0)))))) {
                  *(float *)&(local_1150->intersector1).pointQuery = *local_1148;
                  *(float *)((long)&(local_1150->intersector1).pointQuery + 4) = local_1148[1];
                  *(float *)&(local_1150->intersector1).name = local_1148[2];
                  *(float *)((long)&(local_1150->intersector1).name + 4) = local_1148[3];
                  *(float *)&(local_1150->intersector4).intersect = local_1148[4];
                  *(float *)((long)&(local_1150->intersector4).intersect + 4) = local_1148[5];
                  *(float *)&(local_1150->intersector4).occluded = local_1148[6];
                  *(float *)((long)&(local_1150->intersector4).occluded + 4) = local_1148[7];
                  pbVar40 = (byte *)(ulong)(uint)local_1148[8];
                  *(float *)&(local_1150->intersector4).name = local_1148[8];
                }
                else {
                  *(undefined4 *)&(local_11f8->intersector1).intersect = local_11d8._0_4_;
                }
                *(undefined4 *)(local_11c8 + lVar49 * 4) = 0;
                auVar134._0_8_ = (local_11f8->intersector1).intersect;
                auVar134._8_8_ = (local_11f8->intersector1).occluded;
                fVar58 = (float)auVar134._0_8_;
                local_11c8._0_4_ = -(uint)(auVar125._0_4_ <= fVar58) & local_11c8._0_4_;
                local_11c8._4_4_ = -(uint)(auVar125._4_4_ <= fVar58) & local_11c8._4_4_;
                local_11c8._8_4_ = -(uint)(auVar125._8_4_ <= fVar58) & local_11c8._8_4_;
                local_11c8._12_4_ = -(uint)(auVar125._12_4_ <= fVar58) & local_11c8._12_4_;
                uVar53 = *(uint *)((long)&(local_11f8->intersector1).intersect + 4);
                ray = local_11a8;
                lVar42 = local_11b0;
              }
              iVar36 = movmskps((int)pbVar40,local_11c8);
              if (iVar36 == 0) goto LAB_00574647;
              uVar54 = local_11c8._0_4_;
              uVar55 = local_11c8._4_4_;
              uVar56 = local_11c8._8_4_;
              uVar68 = local_11c8._12_4_;
              auVar74._0_4_ = uVar54 & (uint)auVar125._0_4_;
              auVar74._4_4_ = uVar55 & (uint)auVar125._4_4_;
              auVar74._8_4_ = uVar56 & (uint)auVar125._8_4_;
              auVar74._12_4_ = uVar68 & (uint)auVar125._12_4_;
              auVar85._0_8_ = CONCAT44(~uVar55,~uVar54) & 0x7f8000007f800000;
              auVar85._8_4_ = ~uVar56 & 0x7f800000;
              auVar85._12_4_ = ~uVar68 & 0x7f800000;
              auVar85 = auVar85 | auVar74;
              auVar94._4_4_ = auVar85._0_4_;
              auVar94._0_4_ = auVar85._4_4_;
              auVar94._8_4_ = auVar85._12_4_;
              auVar94._12_4_ = auVar85._8_4_;
              auVar88 = minps(auVar94,auVar85);
              auVar75._0_8_ = auVar88._8_8_;
              auVar75._8_4_ = auVar88._0_4_;
              auVar75._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar75,auVar88);
              auVar76._0_8_ =
                   CONCAT44(-(uint)(auVar88._4_4_ == auVar85._4_4_) & uVar55,
                            -(uint)(auVar88._0_4_ == auVar85._0_4_) & uVar54);
              auVar76._8_4_ = -(uint)(auVar88._8_4_ == auVar85._8_4_) & uVar56;
              auVar76._12_4_ = -(uint)(auVar88._12_4_ == auVar85._12_4_) & uVar68;
              iVar36 = movmskps(iVar36,auVar76);
              auVar64 = local_11c8;
              if (iVar36 != 0) {
                auVar64._8_4_ = auVar76._8_4_;
                auVar64._0_8_ = auVar76._0_8_;
                auVar64._12_4_ = auVar76._12_4_;
              }
              uVar39 = movmskps(iVar36,auVar64);
              uVar37 = CONCAT44((int)((ulong)pbVar40 >> 0x20),uVar39);
              lVar49 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
              goto LAB_005747c4;
            }
          }
LAB_00574647:
          local_11a0 = (RayQueryContext *)((long)&local_11a0->scene + 1);
          context = local_11a0;
          fVar78 = local_fc8;
          fVar101 = fStack_fc4;
          fVar109 = fStack_fc0;
          fVar59 = fStack_fbc;
          fVar66 = local_fd8;
          fVar65 = fStack_fd4;
          fVar67 = fStack_fd0;
          fVar69 = fStack_fcc;
          fVar156 = local_fe8;
          fVar77 = fStack_fe4;
          fVar79 = fStack_fe0;
          fVar86 = fStack_fdc;
          fVar58 = local_ff8;
          fVar87 = fStack_ff4;
          fVar95 = fStack_ff0;
          fVar96 = fStack_fec;
          fVar57 = local_1008;
          fVar97 = fStack_1004;
          fVar98 = fStack_1000;
          fVar99 = fStack_ffc;
          fVar150 = local_1018;
          fVar100 = fStack_1014;
          fVar108 = fStack_1010;
          fVar110 = fStack_100c;
          fVar153 = local_1028;
          fVar111 = fStack_1024;
          fVar117 = fStack_1020;
          fVar118 = fStack_101c;
        }
        fVar80 = *(float *)&(local_11f8->intersector1).intersect;
        auVar88._4_4_ = fVar80;
        auVar88._0_4_ = fVar80;
        auVar88._8_4_ = fVar80;
        auVar88._12_4_ = fVar80;
      }
      goto LAB_00573d51;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }